

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::decodeOpcode(MipsParser *this,string *name,tMipsOpcode *opcode)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  MipsParser *this_00;
  size_t pos;
  size_t local_38;
  
  pcVar4 = opcode->name;
  local_38 = 0;
  (this->registers).grd.num = -1;
  (this->registers).grt.num = -1;
  (this->registers).grs.num = -1;
  (this->registers).frd.num = -1;
  (this->registers).frt.num = -1;
  (this->registers).frs.num = -1;
  (this->registers).vrd.num = -1;
  (this->registers).vrt.num = -1;
  (this->registers).vrs.num = -1;
  (this->registers).ps2vrd.num = -1;
  (this->registers).ps2vrt.num = -1;
  (this->registers).ps2vrs.num = -1;
  (this->registers).rspvrd.num = -1;
  (this->registers).rspvrt.num = -1;
  (this->registers).rspvrs.num = -1;
  (this->registers).rspvealt.num = -1;
  (this->registers).rspvde.num = -1;
  (this->registers).rspve.num = -1;
  this_00 = (MipsParser *)&this->immediate;
  MipsImmediateData::reset((MipsImmediateData *)this_00);
  (this->opcodeData).vfpuSize = -1;
  (this->opcodeData).vectorCondition = -1;
  this->hasFixedSecondaryImmediate = false;
  cVar2 = *pcVar4;
  if (cVar2 != '\0') {
    do {
      pcVar4 = pcVar4 + 1;
      if (cVar2 == 'B') {
        bVar3 = decodeCop2BranchCondition
                          (this_00,name,&local_38,&(this->immediate).secondary.originalValue);
        if (!bVar3) {
          return false;
        }
        (this->immediate).secondary.type = Cop2BranchType;
        (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
        this->hasFixedSecondaryImmediate = true;
      }
      else if (cVar2 == 'S') {
        bVar3 = decodeVfpuType(this_00,name,&local_38,&(this->opcodeData).vfpuSize);
        if (!bVar3) {
          return false;
        }
      }
      else {
        if (name->_M_string_length <= local_38) {
          return false;
        }
        pcVar1 = (name->_M_dataplus)._M_p + local_38;
        local_38 = local_38 + 1;
        if (cVar2 != *pcVar1) {
          return false;
        }
      }
      cVar2 = *pcVar4;
    } while (cVar2 != '\0');
  }
  return name->_M_string_length <= local_38;
}

Assistant:

bool MipsParser::decodeOpcode(const std::string& name, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();
	hasFixedSecondaryImmediate = false;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			CHECK(decodeVfpuType(name,pos,opcodeData.vfpuSize));
			break;
		case 'B':
			CHECK(decodeCop2BranchCondition(name,pos,immediate.secondary.originalValue));
			immediate.secondary.type = MipsImmediateType::Cop2BranchType;
			immediate.secondary.value = immediate.secondary.originalValue;
			hasFixedSecondaryImmediate = true;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}